

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

HeapString * __thiscall
jsonnet::internal::(anonymous_namespace)::Interpreter::
makeHeap<jsonnet::internal::(anonymous_namespace)::HeapString,std::__cxx11::u32string_const&>
          (Interpreter *this,
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *args)

{
  Value v;
  bool bVar1;
  iterator this_00;
  reference ppVar2;
  Heap *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>
  *sourceVal;
  iterator __end4_1;
  iterator __begin4_1;
  SourceFuncMap *__range4_1;
  HeapThunk *thunk;
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>
  *pair;
  iterator __end4;
  iterator __begin4;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
  *__range4;
  HeapString *r;
  HeapEntity *in_stack_00000198;
  Heap *in_stack_000001a0;
  Heap *in_stack_ffffffffffffff90;
  _Self in_stack_ffffffffffffff98;
  anon_union_8_3_4e909c26_for_v in_stack_ffffffffffffffa0;
  Heap *in_stack_ffffffffffffffa8;
  Stack *in_stack_ffffffffffffffb0;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_ffffffffffffffb8;
  _Self in_stack_ffffffffffffffc0;
  _Self local_38;
  double *local_30;
  undefined8 local_28;
  double local_20;
  HeapString *local_18;
  
  local_18 = Heap::
             makeEntity<jsonnet::internal::(anonymous_namespace)::HeapString,std::__cxx11::u32string_const&>
                       ((Heap *)in_stack_ffffffffffffffc0._M_node,in_stack_ffffffffffffffb8);
  bVar1 = anon_unknown_0::Heap::checkHeap(in_RDI);
  if (bVar1) {
    anon_unknown_0::Heap::markFrom(in_stack_000001a0,in_stack_00000198);
    anon_unknown_0::Stack::mark(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_28 = *(undefined8 *)(in_RDI + 1);
    local_20 = in_RDI[1].gcTuneGrowthTrigger;
    v.v.h = in_stack_ffffffffffffffa0.h;
    v._0_8_ = in_stack_ffffffffffffff98._M_node;
    anon_unknown_0::Heap::markFrom(in_stack_ffffffffffffff90,v);
    local_30 = &in_RDI[3].gcTuneGrowthTrigger;
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
         ::begin((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
                  *)in_RDI);
    this_00 = std::
              map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
              ::end((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
                     *)in_RDI);
    while (bVar1 = std::operator!=(&local_38,(_Self *)&stack0xffffffffffffffc0), bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>
                            *)in_stack_ffffffffffffff90);
      if (ppVar2->second->thunk != (HeapThunk *)0x0) {
        anon_unknown_0::Heap::markFrom(in_stack_000001a0,in_stack_00000198);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>
                    *)in_stack_ffffffffffffff90);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
             *)in_RDI);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
           *)in_RDI);
    while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffa0,
                                   (_Self *)&stack0xffffffffffffff98), bVar1) {
      in_stack_ffffffffffffff90 =
           (Heap *)std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                                *)in_stack_ffffffffffffff90);
      anon_unknown_0::Heap::markFrom(in_stack_000001a0,in_stack_00000198);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                    *)in_stack_ffffffffffffff90);
    }
    anon_unknown_0::Heap::sweep((Heap *)this_00._M_node);
  }
  return local_18;
}

Assistant:

T *makeHeap(Args &&... args)
    {
        T *r = heap.makeEntity<T, Args...>(std::forward<Args>(args)...);
        if (heap.checkHeap()) {  // Do a GC cycle?
            // Avoid the object we just made being collected.
            heap.markFrom(r);

            // Mark from the stack.
            stack.mark(heap);

            // Mark from the scratch register
            heap.markFrom(scratch);

            // Mark from cached imports
            for (const auto &pair : cachedImports) {
                HeapThunk *thunk = pair.second->thunk;
                if (thunk != nullptr)
                    heap.markFrom(thunk);
            }

            for (const auto &sourceVal : sourceVals) {
                heap.markFrom(sourceVal.second);
            }

            // Delete unreachable objects.
            heap.sweep();
        }
        return r;
    }